

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O0

Col_Word Col_RopeReplace(Col_Word rope,size_t first,size_t last,Col_Word with)

{
  Col_Word into;
  Col_Word with_local;
  size_t last_local;
  size_t first_local;
  Col_Word rope_local;
  
  rope_local = rope;
  if (first <= last) {
    into = Col_RopeRemove(rope,first,last);
    rope_local = Col_RopeInsert(into,first,with);
  }
  return rope_local;
}

Assistant:

Col_Word
Col_RopeReplace(
    Col_Word rope,  /*!< Original rope. */
    size_t first,   /*!< Index of first character in range to replace. */
    size_t last,    /*!< Index of last character in range to replace. */
    Col_Word with)  /*!< Replacement rope. */
{
    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_ROPE,rope} */
    TYPECHECK_ROPE(rope) return WORD_NIL;

    /*! @typecheck{COL_ERROR_ROPE,with} */
    TYPECHECK_ROPE(with) return WORD_NIL;

    /*
     * Quick cases.
     */

    if (first > last) {
        /*
         * No-op.
         */

        return rope;
    }

    /*
     * General case.
     */

    return Col_RopeInsert(Col_RopeRemove(rope, first, last), first, with);
}